

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaDynAr.h
# Opt level: O0

int __thiscall NaDynAr<double>::insert(NaDynAr<double> *this,int index,double *pobj)

{
  undefined4 *puVar1;
  NaDynAr<double> *this_00;
  item *piVar2;
  double *in_RDX;
  int in_ESI;
  long in_RDI;
  item *pNext;
  item *p;
  undefined8 in_stack_ffffffffffffffb0;
  NaDynAr<double> *this_01;
  
  if (in_RDX != (double *)0x0) {
    this_00 = (NaDynAr<double> *)operator_new(0x10);
    item::item((item *)this_00,in_RDX);
    if (*(int *)(in_RDI + 8) == in_ESI) {
      *(NaDynAr<double> **)(*(long *)(in_RDI + 0x18) + 8) = this_00;
      *(undefined8 *)&this_00->nItems = 0;
    }
    else {
      this_01 = this_00;
      piVar2 = fetch_item(this_00,(int)((ulong)in_stack_ffffffffffffffb0 >> 0x20));
      *(item **)&this_00->nItems = piVar2;
      if (in_ESI == 0) {
        *(NaDynAr<double> **)(in_RDI + 0x10) = this_00;
      }
      else {
        piVar2 = fetch_item(this_01,(int)((ulong)this_00 >> 0x20));
        piVar2->pNext = (item *)this_00;
      }
    }
    *(int *)(in_RDI + 8) = *(int *)(in_RDI + 8) + 1;
    return in_ESI;
  }
  puVar1 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar1 = 0;
  __cxa_throw(puVar1,&NaException::typeinfo,0);
}

Assistant:

virtual int   insert (int index, type* pobj) {
    if(NULL == pobj)
      throw(na_null_pointer);

    item  *p = new item(pobj);

#ifdef DynAr_DEBUG
    NaPrintLog("DynAr::insert(this=0x%08p), %d items, new item=0x%08p at %d\n",
	       this, nItems, p, index);
#endif /* DynAr_DEBUG */

    if(nItems == index){
      pTail->pNext = p;
      p->pNext = NULL;
    }
    else{
      item    *pNext = fetch_item(index);
      p->pNext = pNext;
      if(0 == index)
	pHead = p;
      else
	fetch_item(index - 1)->pNext = p;
    }
    ++nItems;

    return index;
  }